

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O2

void png_read_filter_row_avg3_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  byte *pbVar1;
  byte bVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  char cVar12;
  byte bVar13;
  char cVar14;
  byte bVar15;
  char cVar16;
  byte bVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  byte bVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  byte bVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  byte bVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  byte bVar33;
  char cVar34;
  byte bVar35;
  char cVar36;
  byte bVar37;
  char cVar38;
  byte bVar39;
  
  bVar9 = 0;
  bVar11 = 0;
  bVar13 = 0;
  bVar15 = 0;
  bVar17 = 0;
  bVar19 = 0;
  bVar21 = 0;
  bVar23 = 0;
  bVar25 = 0;
  bVar27 = 0;
  bVar29 = 0;
  bVar31 = 0;
  bVar33 = 0;
  bVar35 = 0;
  bVar37 = 0;
  bVar39 = 0;
  lVar6 = 0;
  for (uVar7 = row_info->rowbytes; 3 < uVar7; uVar7 = uVar7 - 3) {
    pbVar1 = prev + lVar6;
    uVar3 = *(undefined4 *)(row + lVar6);
    cVar8 = pavgb(bVar9,*pbVar1);
    cVar10 = pavgb(bVar11,pbVar1[1]);
    cVar12 = pavgb(bVar13,pbVar1[2]);
    cVar14 = pavgb(bVar15,pbVar1[3]);
    cVar16 = pavgb(bVar17,0);
    cVar18 = pavgb(bVar19,0);
    cVar20 = pavgb(bVar21,0);
    cVar22 = pavgb(bVar23,0);
    cVar24 = pavgb(bVar25,0);
    cVar26 = pavgb(bVar27,0);
    cVar28 = pavgb(bVar29,0);
    cVar30 = pavgb(bVar31,0);
    cVar32 = pavgb(bVar33,0);
    cVar34 = pavgb(bVar35,0);
    cVar36 = pavgb(bVar37,0);
    cVar38 = pavgb(bVar39,0);
    bVar17 = cVar16 - (bVar17 & 1);
    bVar19 = cVar18 - (bVar19 & 1);
    bVar21 = cVar20 - (bVar21 & 1);
    bVar23 = cVar22 - (bVar23 & 1);
    bVar25 = cVar24 - (bVar25 & 1);
    bVar27 = cVar26 - (bVar27 & 1);
    bVar29 = cVar28 - (bVar29 & 1);
    bVar31 = cVar30 - (bVar31 & 1);
    bVar33 = cVar32 - (bVar33 & 1);
    bVar35 = cVar34 - (bVar35 & 1);
    bVar37 = cVar36 - (bVar37 & 1);
    bVar39 = cVar38 - (bVar39 & 1);
    bVar9 = (cVar8 - ((bVar9 ^ *pbVar1) & 1)) + (char)uVar3;
    bVar11 = (cVar10 - ((bVar11 ^ pbVar1[1]) & 1)) + (char)((uint)uVar3 >> 8);
    bVar13 = (cVar12 - ((bVar13 ^ pbVar1[2]) & 1)) + (char)((uint)uVar3 >> 0x10);
    bVar15 = (cVar14 - ((bVar15 ^ pbVar1[3]) & 1)) + (char)((uint)uVar3 >> 0x18);
    row[lVar6] = bVar9;
    (row + lVar6)[1] = bVar11;
    row[lVar6 + 2] = bVar13;
    lVar6 = lVar6 + 3;
  }
  if (uVar7 != 0) {
    bVar4 = prev[lVar6];
    bVar5 = (prev + lVar6)[1];
    bVar2 = prev[lVar6 + 2];
    cVar8 = pavgb(bVar9,bVar4);
    cVar10 = pavgb(bVar11,bVar5);
    cVar12 = pavgb(bVar13,bVar2);
    pavgb(bVar15,0);
    pavgb(bVar17,0);
    pavgb(bVar19,0);
    pavgb(bVar21,0);
    pavgb(bVar23,0);
    pavgb(bVar25,0);
    pavgb(bVar27,0);
    pavgb(bVar29,0);
    pavgb(bVar31,0);
    pavgb(bVar33,0);
    pavgb(bVar35,0);
    pavgb(bVar37,0);
    pavgb(bVar39,0);
    *(ushort *)(row + lVar6) =
         CONCAT11((cVar10 + (char)((ushort)*(undefined2 *)(row + lVar6) >> 8)) -
                  ((bVar11 ^ bVar5) & 1),
                  (cVar8 + (char)*(undefined2 *)(row + lVar6)) - ((bVar9 ^ bVar4) & 1));
    row[lVar6 + 2] = (cVar12 + row[lVar6 + 2]) - ((bVar13 ^ bVar2) & 1);
  }
  return;
}

Assistant:

void png_read_filter_row_avg3_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* The Avg filter predicts each pixel as the (truncated) average of a and b.
    * There's no pixel to the left of the first pixel.  Luckily, it's
    * predicted to be half of the pixel above it.  So again, this works
    * perfectly with our loop if we make sure a starts at zero.
    */

   size_t rb;

   const __m128i zero = _mm_setzero_si128();

   __m128i    b;
   __m128i a, d = zero;

   png_debug(1, "in png_read_filter_row_avg3_sse2");
   rb = row_info->rowbytes;
   while (rb >= 4) {
      __m128i avg;
             b = load4(prev);
      a = d; d = load4(row );

      /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
      avg = _mm_avg_epu8(a,b);
      /* ...but we can fix it up by subtracting off 1 if it rounded up. */
      avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a,b),
                                            _mm_set1_epi8(1)));
      d = _mm_add_epi8(d, avg);
      store3(row, d);

      prev += 3;
      row  += 3;
      rb   -= 3;
   }
   if (rb > 0) {
      __m128i avg;
             b = load3(prev);
      a = d; d = load3(row );

      /* PNG requires a truncating average, so we can't just use _mm_avg_epu8 */
      avg = _mm_avg_epu8(a,b);
      /* ...but we can fix it up by subtracting off 1 if it rounded up. */
      avg = _mm_sub_epi8(avg, _mm_and_si128(_mm_xor_si128(a,b),
                                            _mm_set1_epi8(1)));

      d = _mm_add_epi8(d, avg);
      store3(row, d);

      prev += 3;
      row  += 3;
      rb   -= 3;
   }
}